

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cfb1b::FilteredDirectoryContentsTask::start
          (FilteredDirectoryContentsTask *this,TaskInterface ti)

{
  size_t in_RCX;
  StringRef path;
  StringRef path_00;
  string local_70 [32];
  string local_50 [32];
  TaskInterface ti_local;
  
  ti_local.ctx = ti.ctx;
  ti_local.impl = ti.impl;
  path.Length = in_RCX;
  path.Data = (char *)(this->path)._M_string_length;
  llbuild::buildsystem::BuildKey::makeNode
            ((BuildKey *)local_70,(BuildKey *)(this->path)._M_dataplus._M_p,path);
  std::__cxx11::string::string(local_50,local_70);
  llbuild::core::TaskInterface::request(&ti_local,(KeyType *)local_50,0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  path_00.Length = in_RCX;
  path_00.Data = (char *)(this->path)._M_string_length;
  llbuild::buildsystem::BuildKey::makeStat
            ((BuildKey *)local_70,(BuildKey *)(this->path)._M_dataplus._M_p,path_00);
  std::__cxx11::string::string(local_50,local_70);
  llbuild::core::TaskInterface::request(&ti_local,(KeyType *)local_50,1);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // FIXME:
    //
    //engine.taskMustFollow(this, BuildKey::makeNode(path).toData());
    //
    // The taskMustFollow method expresses the weak dependency we have on
    // 'path', but only at the task level. What we really want is to say at the
    // 'isResultValid'/scanning level is 'must scan after'. That way we hold up
    // this and downstream rules until the 'path' node has been set into its
    // final state*.
    //
    // Here we depend on the file node so that it can be connected up to
    // potential producers and the raw stat information, in case something else
    // has changed the contents of the directory. The value does not encode the
    // raw stat information, thus will produce the same result if the filtered
    // contents is otherwise the same. This reduces unnecessary rebuilds. That
    // said, we are still subject to the 'final state' problem:
    //
    // * The 'final state' of a directory is also a thorny patch of toxic land
    // mines. We really want directory contents to weakly depend upon anything
    // that is currently and/or may be altered within it. i.e. if one rule
    // creates the directory and another rule writes a file into it, we want to
    // defer scanning until both of them have been scanned and possibly run.
    // Having a 'must scan after' would help with the first rule (mkdir), but
    // not the second, in particular if rules are added in subsequent builds.
    // Related rdar://problem/30638921
    ti.request(BuildKey::makeNode(path).toData(), /*inputID=*/0);
    ti.request(BuildKey::makeStat(path).toData(), /*inputID=*/1);
  }